

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

int __thiscall ncnn::GRU::forward(GRU *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  void *__src;
  void *__dest;
  long in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar4;
  float *ptr_2;
  float *pr;
  float *pf;
  int i_2;
  int ret1;
  int ret0;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret;
  Mat hidden;
  int num_directions;
  int T;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff118;
  size_t in_stack_fffffffffffff120;
  undefined8 in_stack_fffffffffffff128;
  undefined4 **ppuVar5;
  Mat *in_stack_fffffffffffff130;
  bool local_d71;
  bool local_d51;
  Mat *in_stack_fffffffffffff310;
  Mat *in_stack_fffffffffffff318;
  Mat *in_stack_fffffffffffff320;
  undefined8 in_stack_fffffffffffff328;
  Mat *in_stack_fffffffffffff330;
  undefined4 in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff33c;
  bool local_c79;
  int local_c5c;
  void *local_c58;
  int *local_c50;
  ulong local_c48;
  undefined4 local_c40;
  long *local_c38;
  int local_c30;
  int local_c2c;
  int local_c28;
  undefined4 local_c24;
  undefined4 local_c20;
  ulong local_c18;
  void *local_c10;
  int *local_c08;
  ulong local_c00;
  undefined4 local_bf8;
  long *local_bf0;
  int local_be8;
  int local_be4;
  int local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  ulong local_bd0;
  void *local_bc8;
  int *local_bc0;
  ulong local_bb8;
  undefined4 local_bb0;
  long *local_ba8;
  int local_ba0;
  int local_b9c;
  int local_b98;
  undefined4 local_b94;
  undefined4 local_b90;
  ulong local_b88;
  int local_b7c;
  void *local_b78;
  int *local_b70;
  ulong local_b68;
  undefined4 local_b60;
  long *local_b58;
  int local_b50;
  int local_b4c;
  int local_b48;
  undefined4 local_b44;
  undefined4 local_b40;
  ulong local_b38;
  void *local_b30;
  int *local_b28;
  Mat *in_stack_fffffffffffff4e0;
  Mat *hidden_state;
  undefined4 uVar6;
  Option *in_stack_fffffffffffff4e8;
  void *local_ae8;
  int *local_ae0;
  ulong local_ad8;
  undefined4 local_ad0;
  long *local_ac8;
  int local_ac0;
  int local_abc;
  int local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  ulong local_aa8;
  int local_a9c;
  void *local_a98;
  int *local_a90;
  long local_a88;
  undefined4 local_a80;
  long *local_a78;
  undefined4 local_a70;
  int local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  int local_a60;
  long local_a58;
  void *local_a50;
  int *local_a48;
  long local_a40;
  undefined4 local_a38;
  long *local_a30;
  undefined4 local_a28;
  int local_a24;
  undefined4 local_a20;
  undefined4 local_a1c;
  int local_a18;
  long local_a10;
  void *local_a08;
  int *local_a00;
  ulong local_9f8;
  undefined4 local_9f0;
  long *local_9e8;
  int local_9e0;
  int local_9dc;
  int local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  ulong local_9c8;
  Mat local_9c0;
  void *local_978;
  int *local_970;
  ulong local_968;
  undefined4 local_960;
  long *local_958;
  int local_950;
  int local_94c;
  int local_948;
  undefined4 local_944;
  undefined4 local_940;
  ulong local_938;
  int local_92c;
  int local_928;
  undefined4 *local_918;
  int *local_910;
  undefined8 local_908;
  undefined4 local_900;
  long *local_8f8;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  int local_8e0;
  long local_8d8;
  undefined4 local_8d0;
  int local_8cc;
  long local_8c8;
  Mat *local_8c0;
  undefined8 local_8b8;
  int local_8a4;
  void **local_8a0;
  Mat *local_890;
  void **local_880;
  void **local_870;
  void **local_860;
  void **local_850;
  void **local_840;
  void **local_830;
  void **local_820;
  void **local_810;
  void **local_800;
  undefined4 **local_7f0;
  void **local_7e0;
  void **local_7d8;
  Mat *local_7d0;
  undefined4 **local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined4 local_7ac;
  undefined4 **local_7a8;
  int local_79c;
  undefined4 *local_798;
  int local_790;
  undefined4 local_78c;
  undefined4 **local_788;
  int local_77c;
  undefined4 *local_778;
  int local_770;
  undefined4 local_76c;
  undefined4 **local_768;
  undefined1 local_75d;
  undefined4 local_75c;
  long *local_758;
  void **local_750;
  undefined1 local_73d;
  undefined4 local_73c;
  long *local_738;
  void **local_730;
  undefined1 local_71d;
  undefined4 local_71c;
  long *local_718;
  void **local_710;
  undefined1 local_6fd;
  undefined4 local_6fc;
  undefined8 *local_6f8;
  void **local_6f0;
  undefined1 local_6dd;
  undefined4 local_6dc;
  undefined8 *local_6d8;
  void **local_6d0;
  undefined1 local_6bd;
  undefined4 local_6bc;
  undefined8 *local_6b8;
  void **local_6b0;
  undefined1 local_69d;
  undefined4 local_69c;
  undefined8 *local_698;
  void **local_690;
  undefined1 local_67d;
  undefined4 local_67c;
  Mat *local_678;
  Mat *local_670;
  undefined1 local_65d;
  undefined4 local_65c;
  undefined8 *local_658;
  void **local_650;
  undefined8 local_640;
  undefined8 local_638;
  int local_630;
  undefined4 local_62c;
  void **local_628;
  undefined8 local_620;
  undefined8 local_618;
  int local_610;
  undefined4 local_60c;
  void **local_608;
  int local_5fc;
  Mat *local_5f8;
  int local_5ec;
  void **local_5e8;
  int local_5dc;
  void **local_5d8;
  int local_530;
  undefined4 local_52c;
  undefined4 **local_528;
  int local_510;
  undefined4 local_50c;
  void **local_508;
  int local_4f0;
  undefined4 local_4ec;
  void **local_4e8;
  int local_4d0;
  undefined4 local_4cc;
  void **local_4c8;
  int local_4b0;
  undefined4 local_4ac;
  void **local_4a8;
  int local_490;
  undefined4 local_48c;
  void **local_488;
  int local_470;
  undefined4 local_46c;
  void **local_468;
  int local_450;
  undefined4 local_44c;
  void **local_448;
  int local_430;
  undefined4 local_42c;
  void **local_428;
  int local_410;
  undefined4 local_40c;
  void **local_408;
  int local_3f0;
  undefined4 local_3ec;
  Mat *local_3e8;
  int local_3d0;
  undefined4 local_3cc;
  void **local_3c8;
  void *local_3c0;
  void *local_3b0;
  void *local_3a0;
  void *local_390;
  void *local_380;
  void *local_370;
  void *local_360;
  void *local_350;
  void *local_340;
  void *local_330;
  void *local_320;
  undefined4 *local_310;
  undefined4 **local_2b8;
  undefined4 **local_2b0;
  undefined4 **local_2a8;
  Mat *local_2a0;
  void **local_298;
  void **local_290;
  long *local_288;
  undefined4 local_27c;
  ulong local_278;
  void *local_270;
  undefined4 local_264;
  int local_260;
  int local_25c;
  void **local_258;
  Allocator *local_250;
  int local_244;
  ulong local_240;
  void *local_238;
  int local_22c;
  int local_228;
  int local_224;
  Mat *local_220;
  long *local_218;
  undefined4 local_20c;
  ulong local_208;
  void *local_200;
  undefined4 local_1f4;
  int local_1f0;
  int local_1ec;
  void **local_1e8;
  long *local_1e0;
  undefined4 local_1d4;
  ulong local_1d0;
  void *local_1c8;
  undefined4 local_1bc;
  int local_1b8;
  int local_1b4;
  void **local_1b0;
  long *local_1a8;
  undefined4 local_19c;
  Mat *local_198;
  void *local_190;
  undefined4 local_184;
  int local_180;
  int local_17c;
  void **local_178;
  long *local_170;
  undefined4 local_164;
  ulong local_160;
  void *local_158;
  undefined4 local_14c;
  int local_148;
  int local_144;
  void **local_140;
  long *local_138;
  undefined4 local_12c;
  ulong local_128;
  void *local_120;
  undefined4 local_114;
  int local_110;
  int local_10c;
  void **local_108;
  long *local_100;
  undefined4 local_f4;
  ulong local_f0;
  void *local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  void **local_d0;
  long *local_c8;
  undefined4 local_bc;
  ulong local_b8;
  void *local_b0;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  void **local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffff328 >> 0x20);
  local_8cc = *(int *)(in_RSI + 0x30);
  local_8d0 = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_8d0 = 2;
  }
  local_7ac = *(undefined4 *)(in_RDI + 0xd0);
  local_7c0 = *(undefined8 *)(in_RCX + 0x10);
  local_7a8 = &local_918;
  local_7b8 = 4;
  local_918 = (undefined4 *)0x0;
  local_910 = (int *)0x0;
  local_908 = 0;
  local_900 = 0;
  local_8f8 = (long *)0x0;
  local_8f0 = 0;
  local_8ec = 0;
  local_8e8 = 0;
  local_8e4 = 0;
  local_8e0 = 0;
  local_8d8 = 0;
  local_8c8 = in_RCX;
  local_8c0 = in_RDX;
  local_8b8 = in_RSI;
  Mat::create(in_stack_fffffffffffff130,(int)((ulong)in_stack_fffffffffffff128 >> 0x20),
              in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  local_7c8 = &local_918;
  if (local_918 != (undefined4 *)0x0) {
    local_2a8 = local_7c8;
  }
  local_c79 = local_918 != (undefined4 *)0x0 && local_8d8 * local_8e0 != 0;
  if (local_c79) {
    local_768 = &local_918;
    local_76c = 0;
    local_770 = (int)local_8d8 * local_8e0;
    local_778 = local_918;
    for (local_77c = 0; local_77c < local_770; local_77c = local_77c + 1) {
      *local_778 = 0;
      local_778 = local_778 + 1;
    }
    local_2b8 = local_768;
    Mat::create(in_stack_fffffffffffff130,(int)((ulong)in_stack_fffffffffffff128 >> 0x20),
                (int)in_stack_fffffffffffff128,in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    local_7d0 = local_8c0;
    bVar4 = true;
    if (local_8c0->data != (void *)0x0) {
      local_2a0 = local_8c0;
      bVar4 = local_8c0->cstep * (long)local_8c0->c == 0;
    }
    if (bVar4) {
      local_8a4 = -100;
      local_928 = 1;
    }
    else {
      if ((*(int *)(in_RDI + 0xd8) == 0) || (*(int *)(in_RDI + 0xd8) == 1)) {
        in_stack_fffffffffffff33c = *(undefined4 *)(in_RDI + 0xd8);
        local_658 = (undefined8 *)(in_RDI + 0x128);
        local_650 = &local_978;
        local_25c = *(int *)(in_RDI + 0x154);
        local_260 = *(int *)(in_RDI + 0x158);
        local_264 = *(undefined4 *)(in_RDI + 0x15c);
        local_270 = (void *)*local_658;
        local_278 = *(ulong *)(in_RDI + 0x138);
        local_27c = *(undefined4 *)(in_RDI + 0x140);
        local_288 = *(long **)(in_RDI + 0x148);
        local_258 = &local_978;
        local_970 = (int *)0x0;
        local_944 = 1;
        local_8 = (long)local_25c * (long)local_260 * local_278;
        local_938 = (local_8 + 0xfU & 0xfffffffffffffff0) / local_278;
        local_950 = *(int *)(in_RDI + 0x150) + -1;
        if (*(int *)(in_RDI + 0x150) == 4) {
          local_938 = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
        }
        local_c = 0x10;
        local_65c = 0;
        local_65d = 1;
        in_stack_fffffffffffff310 = (Mat *)(in_RDI + 0x170);
        local_670 = &local_9c0;
        local_67c = 0;
        local_224 = *(int *)(in_RDI + 0x19c);
        local_228 = *(int *)(in_RDI + 0x1a0);
        local_22c = *(int *)(in_RDI + 0x1a4);
        local_238 = in_stack_fffffffffffff310->data;
        local_240 = *(ulong *)(in_RDI + 0x180);
        local_244 = *(int *)(in_RDI + 0x188);
        local_250 = *(Allocator **)(in_RDI + 400);
        in_stack_fffffffffffff318 = &local_9c0;
        local_9c0.refcount = (int *)0x0;
        local_9c0.d = 1;
        local_18 = (long)local_224 * (long)local_228 * local_240;
        local_1c = 0x10;
        local_9c0.cstep = (local_18 + 0xfU & 0xfffffffffffffff0) / local_240;
        local_9c0.dims = *(int *)(in_RDI + 0x198) + -1;
        if (*(int *)(in_RDI + 0x198) == 4) {
          local_9c0.cstep = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
        }
        local_698 = (undefined8 *)(in_RDI + 0xe0);
        local_690 = &local_a08;
        local_1ec = *(int *)(in_RDI + 0x10c);
        local_1f0 = *(int *)(in_RDI + 0x110);
        local_1f4 = *(undefined4 *)(in_RDI + 0x114);
        local_200 = (void *)*local_698;
        local_208 = *(ulong *)(in_RDI + 0xf0);
        local_20c = *(undefined4 *)(in_RDI + 0xf8);
        local_218 = *(long **)(in_RDI + 0x100);
        local_1e8 = &local_a08;
        local_a00 = (int *)0x0;
        local_9d4 = 1;
        local_28 = (long)local_1ec * (long)local_1f0 * local_208;
        local_9c8 = (local_28 + 0xfU & 0xfffffffffffffff0) / local_208;
        local_9e0 = *(int *)(in_RDI + 0x108) + -1;
        if (*(int *)(in_RDI + 0x108) == 4) {
          local_9c8 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
        }
        local_2c = 0x10;
        local_67d = 1;
        local_69c = 0;
        local_69d = 1;
        in_stack_fffffffffffff330 = local_8c0;
        local_678 = in_stack_fffffffffffff310;
        local_220 = in_stack_fffffffffffff318;
        local_a08 = local_200;
        local_9f8 = local_208;
        local_9f0 = local_20c;
        local_9e8 = local_218;
        local_9dc = local_1ec;
        local_9d8 = local_1f0;
        local_9d0 = local_1f4;
        local_9c0.data = local_238;
        local_9c0.elemsize = local_240;
        local_9c0.elempack = local_244;
        local_9c0.allocator = local_250;
        local_9c0.w = local_224;
        local_9c0.h = local_228;
        local_9c0.c = local_22c;
        local_978 = local_270;
        local_968 = local_278;
        local_960 = local_27c;
        local_958 = local_288;
        local_94c = local_25c;
        local_948 = local_260;
        local_940 = local_264;
        iVar3 = local_8b8._4_4_;
        iVar2 = gru((Mat *)CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338),local_8c0,
                    local_8b8._4_4_,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
                    in_stack_fffffffffffff310,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4e8);
        local_8a0 = &local_a08;
        local_3c8 = local_8a0;
        if (local_a00 != (int *)0x0) {
          local_3cc = 0xffffffff;
          LOCK();
          local_3d0 = *local_a00;
          *local_a00 = *local_a00 + -1;
          UNLOCK();
          if (local_3d0 == 1) {
            if (local_9e8 == (long *)0x0) {
              local_3c0 = local_a08;
              if (local_a08 != (void *)0x0) {
                free(local_a08);
              }
            }
            else {
              (**(code **)(*local_9e8 + 0x18))(local_9e8,local_a08);
            }
          }
        }
        local_a08 = (void *)0x0;
        local_9f8 = 0;
        local_9f0 = 0;
        local_9e0 = 0;
        local_9dc = 0;
        local_9d8 = 0;
        local_9d4 = 0;
        local_9d0 = 0;
        local_9c8 = 0;
        local_a00 = (int *)0x0;
        local_890 = &local_9c0;
        local_3e8 = local_890;
        if (local_9c0.refcount != (int *)0x0) {
          local_3ec = 0xffffffff;
          LOCK();
          local_3f0 = *local_9c0.refcount;
          *local_9c0.refcount = *local_9c0.refcount + -1;
          UNLOCK();
          if (local_3f0 == 1) {
            if (local_9c0.allocator == (Allocator *)0x0) {
              local_3b0 = local_9c0.data;
              if (local_9c0.data != (void *)0x0) {
                free(local_9c0.data);
              }
            }
            else {
              (*(local_9c0.allocator)->_vptr_Allocator[3])(local_9c0.allocator,local_9c0.data);
            }
          }
        }
        local_9c0.data = (void *)0x0;
        local_9c0.elemsize = 0;
        local_9c0.elempack = 0;
        local_9c0.dims = 0;
        local_9c0.w = 0;
        local_9c0.h = 0;
        local_9c0.d = 0;
        local_9c0.c = 0;
        local_9c0.cstep = 0;
        local_9c0.refcount = (int *)0x0;
        local_880 = &local_978;
        local_408 = local_880;
        if (local_970 != (int *)0x0) {
          local_40c = 0xffffffff;
          LOCK();
          local_410 = *local_970;
          *local_970 = *local_970 + -1;
          UNLOCK();
          if (local_410 == 1) {
            if (local_958 == (long *)0x0) {
              local_3a0 = local_978;
              if (local_978 != (void *)0x0) {
                free(local_978);
              }
            }
            else {
              (**(code **)(*local_958 + 0x18))(local_958,local_978);
            }
          }
        }
        local_978 = (void *)0x0;
        local_968 = 0;
        local_960 = 0;
        local_950 = 0;
        local_94c = 0;
        local_948 = 0;
        local_944 = 0;
        local_940 = 0;
        local_938 = 0;
        local_970 = (int *)0x0;
        local_92c = iVar2;
        if (iVar2 != 0) {
          local_928 = 1;
          local_8a4 = iVar2;
          goto LAB_01e32fee;
        }
      }
      if (*(int *)(in_RDI + 0xd8) == 2) {
        local_62c = *(undefined4 *)(in_RDI + 0xd0);
        local_640 = *(undefined8 *)(local_8c8 + 0x10);
        local_628 = &local_a50;
        local_630 = local_8cc;
        local_638 = 4;
        local_a50 = (void *)0x0;
        local_a48 = (int *)0x0;
        local_a40 = 0;
        local_a38 = 0;
        local_a30 = (long *)0x0;
        local_a28 = 0;
        local_a24 = 0;
        local_a20 = 0;
        local_a1c = 0;
        local_a18 = 0;
        local_a10 = 0;
        Mat::create(in_stack_fffffffffffff130,(int)((ulong)in_stack_fffffffffffff128 >> 0x20),
                    (int)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
                    in_stack_fffffffffffff118);
        local_7d8 = &local_a50;
        if (local_a50 != (void *)0x0) {
          local_298 = local_7d8;
        }
        local_d51 = local_a50 != (void *)0x0 && local_a10 * local_a18 != 0;
        if (local_d51) {
          local_60c = *(undefined4 *)(in_RDI + 0xd0);
          local_620 = *(undefined8 *)(local_8c8 + 0x10);
          local_608 = &local_a98;
          local_610 = local_8cc;
          local_618 = 4;
          local_a98 = (void *)0x0;
          local_a90 = (int *)0x0;
          local_a88 = 0;
          local_a80 = 0;
          local_a78 = (long *)0x0;
          local_a70 = 0;
          local_a6c = 0;
          local_a68 = 0;
          local_a64 = 0;
          local_a60 = 0;
          local_a58 = 0;
          Mat::create(in_stack_fffffffffffff130,(int)((ulong)in_stack_fffffffffffff128 >> 0x20),
                      (int)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
                      in_stack_fffffffffffff118);
          local_7e0 = &local_a98;
          if (local_a98 != (void *)0x0) {
            local_290 = local_7e0;
          }
          local_d71 = local_a98 != (void *)0x0 && local_a58 * local_a60 != 0;
          if (local_d71) {
            local_6b8 = (undefined8 *)(in_RDI + 0x128);
            local_6b0 = &local_ae8;
            local_1b4 = *(int *)(in_RDI + 0x154);
            local_1b8 = *(int *)(in_RDI + 0x158);
            local_1bc = *(undefined4 *)(in_RDI + 0x15c);
            local_1c8 = (void *)*local_6b8;
            local_1d0 = *(ulong *)(in_RDI + 0x138);
            local_1d4 = *(undefined4 *)(in_RDI + 0x140);
            local_1e0 = *(long **)(in_RDI + 0x148);
            local_1b0 = &local_ae8;
            local_ae0 = (int *)0x0;
            local_ab4 = 1;
            local_38 = (long)local_1b4 * (long)local_1b8 * local_1d0;
            local_aa8 = (local_38 + 0xfU & 0xfffffffffffffff0) / local_1d0;
            local_ac0 = *(int *)(in_RDI + 0x150) + -1;
            if (*(int *)(in_RDI + 0x150) == 4) {
              local_aa8 = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
            }
            local_6d8 = (undefined8 *)(in_RDI + 0x170);
            local_6d0 = &local_b30;
            local_17c = *(int *)(in_RDI + 0x19c);
            local_180 = *(int *)(in_RDI + 0x1a0);
            local_184 = *(undefined4 *)(in_RDI + 0x1a4);
            local_190 = (void *)*local_6d8;
            local_198 = *(Mat **)(in_RDI + 0x180);
            local_19c = *(undefined4 *)(in_RDI + 0x188);
            plVar1 = *(long **)(in_RDI + 400);
            local_178 = &local_b30;
            local_b28 = (int *)0x0;
            local_48 = (long)local_17c * (long)local_180 * (long)local_198;
            local_6f8 = (undefined8 *)(in_RDI + 0xe0);
            local_6f0 = &local_b78;
            local_144 = *(int *)(in_RDI + 0x10c);
            local_148 = *(int *)(in_RDI + 0x110);
            local_14c = *(undefined4 *)(in_RDI + 0x114);
            local_158 = (void *)*local_6f8;
            local_160 = *(ulong *)(in_RDI + 0xf0);
            local_164 = *(undefined4 *)(in_RDI + 0xf8);
            local_170 = *(long **)(in_RDI + 0x100);
            local_140 = &local_b78;
            local_b70 = (int *)0x0;
            local_b44 = 1;
            local_58 = (long)local_144 * (long)local_148 * local_160;
            local_b38 = (local_58 + 0xfU & 0xfffffffffffffff0) / local_160;
            local_b50 = *(int *)(in_RDI + 0x108) + -1;
            if (*(int *)(in_RDI + 0x108) == 4) {
              local_b38 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
            }
            local_3c = 0x10;
            local_4c = 0x10;
            local_5c = 0x10;
            local_6bc = 0;
            local_6bd = 1;
            local_6dc = 0;
            local_6dd = 1;
            local_6fc = 0;
            local_6fd = 1;
            local_1a8 = plVar1;
            local_b78 = local_158;
            local_b68 = local_160;
            local_b60 = local_164;
            local_b58 = local_170;
            local_b4c = local_144;
            local_b48 = local_148;
            local_b40 = local_14c;
            local_b30 = local_190;
            local_ae8 = local_1c8;
            local_ad8 = local_1d0;
            local_ad0 = local_1d4;
            local_ac8 = local_1e0;
            local_abc = local_1b4;
            local_ab8 = local_1b8;
            local_ab0 = local_1bc;
            iVar2 = gru((Mat *)CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338),
                        in_stack_fffffffffffff330,iVar3,in_stack_fffffffffffff320,
                        in_stack_fffffffffffff318,in_stack_fffffffffffff310,local_198,
                        in_stack_fffffffffffff4e8);
            local_870 = &local_b78;
            local_428 = local_870;
            if (local_b70 != (int *)0x0) {
              local_42c = 0xffffffff;
              LOCK();
              local_430 = *local_b70;
              *local_b70 = *local_b70 + -1;
              UNLOCK();
              if (local_430 == 1) {
                if (local_b58 == (long *)0x0) {
                  local_390 = local_b78;
                  if (local_b78 != (void *)0x0) {
                    free(local_b78);
                  }
                }
                else {
                  (**(code **)(*local_b58 + 0x18))(local_b58,local_b78);
                }
              }
            }
            local_b78 = (void *)0x0;
            local_b68 = 0;
            local_b60 = 0;
            local_b50 = 0;
            local_b4c = 0;
            local_b48 = 0;
            local_b44 = 0;
            local_b40 = 0;
            local_b38 = 0;
            local_b70 = (int *)0x0;
            local_860 = &local_b30;
            local_448 = local_860;
            if (local_b28 != (int *)0x0) {
              local_44c = 0xffffffff;
              LOCK();
              local_450 = *local_b28;
              *local_b28 = *local_b28 + -1;
              UNLOCK();
              if (local_450 == 1) {
                if (plVar1 == (long *)0x0) {
                  local_380 = local_b30;
                  if (local_b30 != (void *)0x0) {
                    free(local_b30);
                  }
                }
                else {
                  (**(code **)(*plVar1 + 0x18))(plVar1,local_b30);
                }
              }
            }
            local_b30 = (void *)0x0;
            hidden_state = (Mat *)0x0;
            uVar6 = 0;
            local_b28 = (int *)0x0;
            local_850 = &local_ae8;
            local_468 = local_850;
            if (local_ae0 != (int *)0x0) {
              local_46c = 0xffffffff;
              LOCK();
              local_470 = *local_ae0;
              *local_ae0 = *local_ae0 + -1;
              UNLOCK();
              if (local_470 == 1) {
                if (local_ac8 == (long *)0x0) {
                  local_370 = local_ae8;
                  if (local_ae8 != (void *)0x0) {
                    free(local_ae8);
                  }
                }
                else {
                  (**(code **)(*local_ac8 + 0x18))(local_ac8,local_ae8);
                }
              }
            }
            local_ae8 = (void *)0x0;
            local_ad8 = 0;
            local_ad0 = 0;
            local_ac0 = 0;
            local_abc = 0;
            local_ab8 = 0;
            local_ab4 = 0;
            local_ab0 = 0;
            local_aa8 = 0;
            local_ae0 = (int *)0x0;
            local_a9c = iVar2;
            if (iVar2 == 0) {
              local_788 = &local_918;
              local_790 = (int)local_8d8 * local_8e0;
              local_798 = local_918;
              for (local_79c = 0; local_79c < local_790; local_79c = local_79c + 1) {
                *local_798 = 0;
                local_798 = local_798 + 1;
              }
              local_718 = (long *)(in_RDI + 0x128);
              local_710 = &local_bc8;
              local_10c = *(int *)(in_RDI + 0x154);
              local_110 = *(int *)(in_RDI + 0x158);
              local_114 = *(undefined4 *)(in_RDI + 0x15c);
              local_120 = (void *)(*local_718 +
                                  *(long *)(in_RDI + 0x168) * *(long *)(in_RDI + 0x138));
              local_128 = *(ulong *)(in_RDI + 0x138);
              local_12c = *(undefined4 *)(in_RDI + 0x140);
              local_138 = *(long **)(in_RDI + 0x148);
              local_108 = &local_bc8;
              local_bc0 = (int *)0x0;
              local_b94 = 1;
              local_68 = (long)local_10c * (long)local_110 * local_128;
              local_b88 = (local_68 + 0xfU & 0xfffffffffffffff0) / local_128;
              local_ba0 = *(int *)(in_RDI + 0x150) + -1;
              if (*(int *)(in_RDI + 0x150) == 4) {
                local_b88 = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
              }
              local_738 = (long *)(in_RDI + 0x170);
              local_730 = &local_c10;
              local_d4 = *(int *)(in_RDI + 0x19c);
              local_d8 = *(int *)(in_RDI + 0x1a0);
              local_dc = *(undefined4 *)(in_RDI + 0x1a4);
              local_e8 = (void *)(*local_738 + *(long *)(in_RDI + 0x1b0) * *(long *)(in_RDI + 0x180)
                                 );
              local_f0 = *(ulong *)(in_RDI + 0x180);
              local_f4 = *(undefined4 *)(in_RDI + 0x188);
              local_100 = *(long **)(in_RDI + 400);
              local_d0 = &local_c10;
              local_c08 = (int *)0x0;
              local_bdc = 1;
              local_78 = (long)local_d4 * (long)local_d8 * local_f0;
              local_bd0 = (local_78 + 0xfU & 0xfffffffffffffff0) / local_f0;
              local_be8 = *(int *)(in_RDI + 0x198) + -1;
              if (*(int *)(in_RDI + 0x198) == 4) {
                local_bd0 = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
              }
              local_758 = (long *)(in_RDI + 0xe0);
              local_750 = &local_c58;
              local_9c = *(int *)(in_RDI + 0x10c);
              local_a0 = *(int *)(in_RDI + 0x110);
              local_a4 = *(undefined4 *)(in_RDI + 0x114);
              local_b0 = (void *)(*local_758 + *(long *)(in_RDI + 0x120) * *(long *)(in_RDI + 0xf0))
              ;
              local_b8 = *(ulong *)(in_RDI + 0xf0);
              local_bc = *(undefined4 *)(in_RDI + 0xf8);
              local_c8 = *(long **)(in_RDI + 0x100);
              local_98 = &local_c58;
              local_c50 = (int *)0x0;
              local_c24 = 1;
              local_88 = (long)local_9c * (long)local_a0 * local_b8;
              local_c18 = (local_88 + 0xfU & 0xfffffffffffffff0) / local_b8;
              local_c30 = *(int *)(in_RDI + 0x108) + -1;
              if (*(int *)(in_RDI + 0x108) == 4) {
                local_c18 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
              }
              local_6c = 0x10;
              local_7c = 0x10;
              local_8c = 0x10;
              local_71c = 1;
              local_71d = 1;
              local_73c = 1;
              local_73d = 1;
              local_75c = 1;
              local_75d = 1;
              local_78c = 0;
              local_aa8 = 0;
              local_ac0 = 0;
              local_2b0 = local_788;
              local_c58 = local_b0;
              local_c48 = local_b8;
              local_c40 = local_bc;
              local_c38 = local_c8;
              local_c2c = local_9c;
              local_c28 = local_a0;
              local_c20 = local_a4;
              local_c10 = local_e8;
              local_c00 = local_f0;
              local_bf8 = local_f4;
              local_bf0 = local_100;
              local_be4 = local_d4;
              local_be0 = local_d8;
              local_bd8 = local_dc;
              local_bc8 = local_120;
              local_bb8 = local_128;
              local_bb0 = local_12c;
              local_ba8 = local_138;
              local_b9c = local_10c;
              local_b98 = local_110;
              local_b90 = local_114;
              iVar3 = gru((Mat *)CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338),
                          in_stack_fffffffffffff330,iVar3,in_stack_fffffffffffff320,
                          in_stack_fffffffffffff318,in_stack_fffffffffffff310,hidden_state,
                          in_stack_fffffffffffff4e8);
              local_840 = &local_c58;
              local_488 = local_840;
              if (local_c50 != (int *)0x0) {
                local_48c = 0xffffffff;
                LOCK();
                local_490 = *local_c50;
                *local_c50 = *local_c50 + -1;
                UNLOCK();
                if (local_490 == 1) {
                  if (local_c38 == (long *)0x0) {
                    local_360 = local_c58;
                    if (local_c58 != (void *)0x0) {
                      free(local_c58);
                    }
                  }
                  else {
                    (**(code **)(*local_c38 + 0x18))(local_c38,local_c58);
                  }
                }
              }
              local_c58 = (void *)0x0;
              local_c48 = 0;
              local_c40 = 0;
              local_c30 = 0;
              local_c2c = 0;
              local_c28 = 0;
              local_c24 = 0;
              local_c20 = 0;
              local_c18 = 0;
              local_c50 = (int *)0x0;
              local_830 = &local_c10;
              local_4a8 = local_830;
              if (local_c08 != (int *)0x0) {
                local_4ac = 0xffffffff;
                LOCK();
                local_4b0 = *local_c08;
                *local_c08 = *local_c08 + -1;
                UNLOCK();
                if (local_4b0 == 1) {
                  if (local_bf0 == (long *)0x0) {
                    local_350 = local_c10;
                    if (local_c10 != (void *)0x0) {
                      free(local_c10);
                    }
                  }
                  else {
                    (**(code **)(*local_bf0 + 0x18))(local_bf0,local_c10);
                  }
                }
              }
              local_c10 = (void *)0x0;
              local_c00 = 0;
              local_bf8 = 0;
              local_be8 = 0;
              local_be4 = 0;
              local_be0 = 0;
              local_bdc = 0;
              local_bd8 = 0;
              local_bd0 = 0;
              local_c08 = (int *)0x0;
              local_820 = &local_bc8;
              local_4c8 = local_820;
              if (local_bc0 != (int *)0x0) {
                local_4cc = 0xffffffff;
                LOCK();
                local_4d0 = *local_bc0;
                *local_bc0 = *local_bc0 + -1;
                UNLOCK();
                if (local_4d0 == 1) {
                  if (local_ba8 == (long *)0x0) {
                    local_340 = local_bc8;
                    if (local_bc8 != (void *)0x0) {
                      free(local_bc8);
                    }
                  }
                  else {
                    (**(code **)(*local_ba8 + 0x18))(local_ba8,local_bc8);
                  }
                }
              }
              local_bc8 = (void *)0x0;
              local_bb8 = 0;
              local_bb0 = 0;
              local_ba0 = 0;
              local_b9c = 0;
              local_b98 = 0;
              local_b94 = 0;
              local_b90 = 0;
              local_b88 = 0;
              local_bc0 = (int *)0x0;
              local_b7c = iVar3;
              if (iVar3 == 0) {
                for (local_c5c = 0; local_c5c < local_8cc; local_c5c = local_c5c + 1) {
                  local_5d8 = &local_a50;
                  local_5dc = local_c5c;
                  local_5e8 = &local_a98;
                  local_5ec = local_c5c;
                  __src = (void *)((long)local_a98 + (long)local_a6c * (long)local_c5c * local_a88);
                  local_5f8 = local_8c0;
                  local_5fc = local_c5c;
                  __dest = (void *)((long)local_8c0->data +
                                   (long)local_8c0->w * (long)local_c5c * local_8c0->elemsize);
                  memcpy(__dest,(void *)((long)local_a50 +
                                        (long)local_a24 * (long)local_c5c * local_a40),
                         (long)*(int *)(in_RDI + 0xd0) << 2);
                  memcpy((void *)((long)__dest + (long)*(int *)(in_RDI + 0xd0) * 4),__src,
                         (long)*(int *)(in_RDI + 0xd0) << 2);
                }
                local_928 = 0;
              }
              else {
                local_928 = 1;
                local_8a4 = iVar3;
              }
            }
            else {
              local_928 = 1;
              local_8a4 = iVar2;
            }
          }
          else {
            local_8a4 = -100;
            local_928 = 1;
          }
          local_810 = &local_a98;
          local_4e8 = local_810;
          if (local_a90 != (int *)0x0) {
            local_4ec = 0xffffffff;
            LOCK();
            local_4f0 = *local_a90;
            *local_a90 = *local_a90 + -1;
            UNLOCK();
            if (local_4f0 == 1) {
              if (local_a78 == (long *)0x0) {
                local_330 = local_a98;
                if (local_a98 != (void *)0x0) {
                  free(local_a98);
                }
              }
              else {
                (**(code **)(*local_a78 + 0x18))(local_a78,local_a98);
              }
            }
          }
          local_a98 = (void *)0x0;
          local_a88 = 0;
          local_a80 = 0;
          local_a70 = 0;
          local_a6c = 0;
          local_a68 = 0;
          local_a64 = 0;
          local_a60 = 0;
          local_a58 = 0;
          local_a90 = (int *)0x0;
        }
        else {
          local_8a4 = -100;
          local_928 = 1;
        }
        local_800 = &local_a50;
        local_508 = local_800;
        if (local_a48 != (int *)0x0) {
          local_50c = 0xffffffff;
          LOCK();
          local_510 = *local_a48;
          *local_a48 = *local_a48 + -1;
          UNLOCK();
          if (local_510 == 1) {
            if (local_a30 == (long *)0x0) {
              local_320 = local_a50;
              if (local_a50 != (void *)0x0) {
                free(local_a50);
              }
            }
            else {
              (**(code **)(*local_a30 + 0x18))(local_a30,local_a50);
            }
          }
        }
        local_a50 = (void *)0x0;
        local_a40 = 0;
        local_a38 = 0;
        local_a28 = 0;
        local_a24 = 0;
        local_a20 = 0;
        local_a1c = 0;
        local_a18 = 0;
        local_a10 = 0;
        local_a48 = (int *)0x0;
        if (local_928 != 0) goto LAB_01e32fee;
      }
      local_8a4 = 0;
      local_928 = 1;
    }
  }
  else {
    local_8a4 = -100;
    local_928 = 1;
  }
LAB_01e32fee:
  ppuVar5 = &local_918;
  if (local_910 != (int *)0x0) {
    local_52c = 0xffffffff;
    LOCK();
    local_530 = *local_910;
    *local_910 = *local_910 + -1;
    UNLOCK();
    if (local_530 == 1) {
      local_7f0 = ppuVar5;
      local_528 = ppuVar5;
      if (local_8f8 == (long *)0x0) {
        local_310 = local_918;
        if (local_918 != (undefined4 *)0x0) {
          free(local_918);
        }
      }
      else {
        (**(code **)(*local_8f8 + 0x18))(local_8f8,local_918);
      }
    }
  }
  *ppuVar5 = (undefined4 *)0x0;
  ppuVar5[2] = (undefined4 *)0x0;
  *(undefined4 *)(ppuVar5 + 3) = 0;
  *(undefined4 *)(ppuVar5 + 5) = 0;
  *(undefined4 *)((long)ppuVar5 + 0x2c) = 0;
  *(undefined4 *)(ppuVar5 + 6) = 0;
  *(undefined4 *)((long)ppuVar5 + 0x34) = 0;
  *(undefined4 *)(ppuVar5 + 7) = 0;
  ppuVar5[8] = (undefined4 *)0x0;
  ppuVar5[1] = (undefined4 *)0x0;
  return local_8a4;
}

Assistant:

int GRU::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = gru(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = gru(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);

        int ret1 = gru(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}